

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O3

int sexp_is_a_socket_p(int fd)

{
  stat statbuf;
  stat sStack_98;
  
  fstat(fd,&sStack_98);
  return (uint)((sStack_98.st_mode & 0xf000) == 0xc000);
}

Assistant:

int sexp_is_a_socket_p (int fd) {
#if defined(PLAN9) || defined(_WIN32)
  return 0;
#else
  struct stat statbuf;
  fstat(fd, &statbuf);
  return S_ISSOCK(statbuf.st_mode);
#endif
}